

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

bool __thiscall cmCTestHG::UpdateImpl(cmCTestHG *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  string *arg;
  pointer pbVar3;
  string opts;
  vector<const_char_*,_std::allocator<const_char_*>_> hg_update;
  OutputLogger out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  OutputLogger err;
  
  opts._M_dataplus._M_p =
       (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  opts._M_string_length = (size_type)anon_var_dwarf_1bbd2aa;
  opts.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_a42ca9;
  opts.field_2._8_8_ = 0;
  cmProcessTools::OutputLogger::OutputLogger
            (&out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"pull-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"pull-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,(char **)&opts,(OutputParser *)&out,(OutputParser *)&err,
                      (char *)0x0,Auto);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&out.super_LineParser);
  hg_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hg_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hg_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  out.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&hg_update,(char **)&out);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x69131c;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&hg_update,(char **)&out);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)anon_var_dwarf_a42ca9;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&hg_update,(char **)&out);
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"UpdateOptions",(allocator<char> *)&err);
  cmCTest::GetCTestConfiguration(&opts,pcVar1,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  if (opts._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"HGUpdateOptions",(allocator<char> *)&args);
    cmCTest::GetCTestConfiguration((string *)&out,pcVar1,(string *)&err);
    std::__cxx11::string::operator=((string *)&opts,(string *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&err);
  }
  cmSystemTools::ParseArguments(&args,&opts);
  for (pbVar3 = args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    out.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)(pbVar3->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&hg_update,(char **)&out);
  }
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&hg_update,(char **)&out);
  cmProcessTools::OutputLogger::OutputLogger
            (&out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"update-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"update-err> ");
  bVar2 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,
                     hg_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&out,
                     (OutputParser *)&err,Auto);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&out.super_LineParser);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  std::__cxx11::string::~string((string *)&opts);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&hg_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return bVar2;
}

Assistant:

bool cmCTestHG::UpdateImpl()
{
  // Use "hg pull" followed by "hg update" to update the working tree.
  {
    const char* hg = this->CommandLineTool.c_str();
    const char* hg_pull[] = { hg, "pull", "-v", nullptr };
    OutputLogger out(this->Log, "pull-out> ");
    OutputLogger err(this->Log, "pull-err> ");
    this->RunChild(&hg_pull[0], &out, &err);
  }

  // TODO: if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)

  std::vector<char const*> hg_update;
  hg_update.push_back(this->CommandLineTool.c_str());
  hg_update.push_back("update");
  hg_update.push_back("-v");

  // Add user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("HGUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  for (std::string const& arg : args) {
    hg_update.push_back(arg.c_str());
  }

  // Sentinel argument.
  hg_update.push_back(nullptr);

  OutputLogger out(this->Log, "update-out> ");
  OutputLogger err(this->Log, "update-err> ");
  return this->RunUpdateCommand(hg_update.data(), &out, &err);
}